

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiContextTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_0::MultiContextTest::iterate(MultiContextTest *this)

{
  EglTestContext *this_00;
  deUint32 dVar1;
  deBool dVar2;
  TestLog *log_00;
  Library *egl_00;
  NativeDisplay *nativeDisplay;
  EGLDisplay pvVar3;
  EGLDisplay pvVar4;
  EGLConfig pvVar5;
  EGLDisplay display_00;
  EGLDisplay pvVar6;
  MessageBuilder *pMVar7;
  reference ppvVar8;
  GLdouble *pGVar9;
  EGLSurface pvVar10;
  EGLSurface pvVar11;
  size_type sVar12;
  GLuint *extraout_RDX;
  GLenum GVar13;
  Enum<int,_2UL> EVar14;
  value_type local_2520;
  EGLSurface local_24b8;
  size_t contextNdx_1;
  size_t contextNdx;
  string local_2420;
  GetNameFunc local_2400;
  int local_23f8;
  Enum<int,_2UL> local_23f0;
  unsigned_long local_23e0;
  MessageBuilder local_23d8;
  int local_2254;
  int local_2250;
  EGLint makeCurrentError;
  EGLBoolean result;
  GetNameFunc local_2228;
  int local_2220;
  GetNameFunc local_2218;
  int local_2210;
  string local_2208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21e8;
  MessageBuilder local_21c8;
  allocator<char> local_2041;
  string local_2040;
  MessageBuilder local_2020;
  int local_1e9c;
  value_type pvStack_1e98;
  EGLint error;
  EGLContext context;
  EGLContext sharedContext;
  size_t contextCount;
  MessageBuilder local_1e78;
  char *local_1cf8;
  MessageBuilder local_1cf0;
  undefined1 local_1b70 [8];
  Functions gl;
  vector<void_*,_std::allocator<void_*>_> contexts;
  UniqueSurface surface;
  EGLConfig config;
  UniqueDisplay display;
  Library *egl;
  Random rng;
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  ResultCollector resultCollector;
  TestLog *log;
  EGLint pbufferAttribList [5];
  undefined8 local_38;
  EGLint attribList [3];
  size_t minContextCount;
  size_t maxContextCount;
  MultiContextTest *pMStack_10;
  deUint32 seed;
  MultiContextTest *this_local;
  
  maxContextCount._4_4_ = 0x86aa46;
  if (this->m_sharing == SHARING_SHARED) {
    maxContextCount._4_4_ = 0x94ecb894;
  }
  minContextCount = 0x80;
  stack0xffffffffffffffd8 = 0x20;
  local_38 = 0x200003098;
  attribList[0] = 0x3038;
  log = (TestLog *)0x4000003057;
  pbufferAttribList[0] = 0x3056;
  pbufferAttribList[1] = 0x40;
  pbufferAttribList[2] = 0x3038;
  pMStack_10 = this;
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  resultCollector.m_message.field_2._8_8_ = log_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_d1);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_b0,log_00,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  de::Random::Random((Random *)((long)&egl + 4),maxContextCount._4_4_);
  egl_00 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  display.m_display = egl_00;
  nativeDisplay = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar3 = eglu::getAndInitDisplay(nativeDisplay,(Version *)0x0);
  eglu::UniqueDisplay::UniqueDisplay((UniqueDisplay *)&config,egl_00,pvVar3);
  pvVar3 = display.m_display;
  pvVar4 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&config);
  pvVar5 = getConfig((Library *)pvVar3,pvVar4);
  pvVar3 = display.m_display;
  display_00 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&config);
  pvVar4 = display.m_display;
  if (this->m_use == USE_NONE) {
    local_24b8 = (EGLSurface)0x0;
  }
  else {
    pvVar6 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&config);
    local_24b8 = (EGLSurface)(**(code **)(*pvVar4 + 0x50))(pvVar4,pvVar6,pvVar5,&log);
  }
  eglu::UniqueSurface::UniqueSurface
            ((UniqueSurface *)
             &contexts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(Library *)pvVar3,display_00,local_24b8);
  dVar1 = (**(code **)(*display.m_display + 0xf8))();
  eglu::checkError(dVar1,"Failed to create pbuffer.",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiContextTests.cpp"
                   ,0x7f);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)&gl.waitSync);
  glw::Functions::Functions((Functions *)local_1b70);
  std::vector<void_*,_std::allocator<void_*>_>::reserve
            ((vector<void_*,_std::allocator<void_*>_> *)&gl.waitSync,0x80);
  tcu::TestLog::operator<<
            (&local_1cf0,(TestLog *)resultCollector.m_message.field_2._8_8_,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_1cf0,(char (*) [18])"Trying to create ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&minContextCount);
  local_1cf8 = " ";
  if (this->m_sharing == SHARING_SHARED) {
    local_1cf8 = " shared ";
  }
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_1cf8);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [10])0x2b41e43);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1cf0);
  tcu::TestLog::operator<<
            (&local_1e78,(TestLog *)resultCollector.m_message.field_2._8_8_,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_1e78,(char (*) [25])"Requiring that at least ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(unsigned_long *)(attribList + 2));
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [26])" contexts can be created.");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1e78);
  if (this->m_use == USE_CLEAR) {
    this_00 = (this->super_TestCase).m_eglTestCtx;
    contextCount._4_4_ = glu::ApiType::es(2,0);
    EglTestContext::initGLFunctions(this_00,(Functions *)local_1b70,contextCount._4_4_);
  }
  do {
    (*(code *)**display.m_display)(display.m_display,0x30a0);
    dVar1 = (**(code **)(*display.m_display + 0xf8))();
    eglu::checkError(dVar1,"bindAPI(EGL_OPENGL_ES_API)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiContextTests.cpp"
                     ,0x8c);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  sharedContext = (EGLContext)0x0;
  do {
    if ((EGLContext)0x7f < sharedContext) {
LAB_017b70a1:
      for (contextNdx_1 = 0;
          sVar12 = std::vector<void_*,_std::allocator<void_*>_>::size
                             ((vector<void_*,_std::allocator<void_*>_> *)&gl.waitSync),
          contextNdx_1 < sVar12; contextNdx_1 = contextNdx_1 + 1) {
        do {
          pvVar3 = display.m_display;
          pvVar4 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&config);
          ppvVar8 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                              ((vector<void_*,_std::allocator<void_*>_> *)&gl.waitSync,contextNdx_1)
          ;
          (**(code **)(*pvVar3 + 0x98))(pvVar3,pvVar4,*ppvVar8);
          dVar1 = (**(code **)(*display.m_display + 0xf8))();
          eglu::checkError(dVar1,"destroyContext(*display, contexts[contextNdx])",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiContextTests.cpp"
                           ,0xc6);
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
        ppvVar8 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                            ((vector<void_*,_std::allocator<void_*>_> *)&gl.waitSync,contextNdx_1);
        *ppvVar8 = (value_type)0x0;
      }
      if ((this->m_use == USE_MAKECURRENT) || (this->m_use == USE_CLEAR)) {
        do {
          pvVar3 = display.m_display;
          pvVar4 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&config);
          (**(code **)(*pvVar3 + 0x138))(pvVar3,pvVar4,0,0);
          dVar1 = (**(code **)(*display.m_display + 0xf8))();
          eglu::checkError(dVar1,
                           "makeCurrent(*display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiContextTests.cpp"
                           ,0xcb);
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
      }
      tcu::ResultCollector::setTestContextResult
                ((ResultCollector *)local_b0,
                 (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::vector<void_*,_std::allocator<void_*>_>::~vector
                ((vector<void_*,_std::allocator<void_*>_> *)&gl.waitSync);
      eglu::UniqueSurface::~UniqueSurface
                ((UniqueSurface *)
                 &contexts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      eglu::UniqueDisplay::~UniqueDisplay((UniqueDisplay *)&config);
      de::Random::~Random((Random *)((long)&egl + 4));
      tcu::ResultCollector::~ResultCollector((ResultCollector *)local_b0);
      return STOP;
    }
    if ((this->m_sharing == SHARING_SHARED) && (sharedContext != (EGLContext)0x0)) {
      dVar1 = de::Random::getUint32((Random *)((long)&egl + 4));
      ppvVar8 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)&gl.waitSync,
                           (ulong)dVar1 % ((ulong)sharedContext & 0xffffffff));
      local_2520 = *ppvVar8;
    }
    else {
      local_2520 = (value_type)0x0;
    }
    pvVar3 = display.m_display;
    context = local_2520;
    pvVar4 = eglu::UniqueDisplay::operator*((UniqueDisplay *)&config);
    pvStack_1e98 = (value_type)(**(code **)(*pvVar3 + 0x30))(pvVar3,pvVar4,pvVar5,context,&local_38)
    ;
    local_1e9c = (**(code **)(*display.m_display + 0xf8))();
    if ((pvStack_1e98 == (value_type)0x0) || (local_1e9c != 0x3000)) {
      tcu::TestLog::operator<<
                (&local_2020,(TestLog *)resultCollector.m_message.field_2._8_8_,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_2020,(char (*) [26])"Got error after creating ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(unsigned_long *)&sharedContext);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [11])0x2b41e42);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_2020);
      if (local_1e9c == 0x3003) {
        if (sharedContext < (EGLContext)0x20) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2040,
                     "Couldn\'t create the minimum number of contexts required.",&local_2041);
          tcu::ResultCollector::fail((ResultCollector *)local_b0,&local_2040);
          std::__cxx11::string::~string((string *)&local_2040);
          std::allocator<char>::~allocator(&local_2041);
        }
        else {
          tcu::TestLog::operator<<
                    (&local_21c8,(TestLog *)resultCollector.m_message.field_2._8_8_,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<(&local_21c8,(char (*) [19])"Got EGL_BAD_ALLOC.");
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_21c8);
        }
      }
      else {
        EVar14 = eglu::getErrorStr(local_1e9c);
        local_2228 = EVar14.m_getName;
        local_2220 = EVar14.m_value;
        local_2218 = local_2228;
        local_2210 = local_2220;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2208,&local_2218);
        std::operator+(&local_21e8,"eglCreateContext() produced error that is not EGL_BAD_ALLOC: ",
                       &local_2208);
        tcu::ResultCollector::fail((ResultCollector *)local_b0,&local_21e8);
        std::__cxx11::string::~string((string *)&local_21e8);
        std::__cxx11::string::~string((string *)&local_2208);
      }
      if (pvStack_1e98 != (value_type)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&result,
                   "eglCreateContext() produced error, but context is not EGL_NO_CONTEXT",
                   (allocator<char> *)((long)&makeCurrentError + 3));
        tcu::ResultCollector::fail((ResultCollector *)local_b0,(string *)&result);
        std::__cxx11::string::~string((string *)&result);
        std::allocator<char>::~allocator((allocator<char> *)((long)&makeCurrentError + 3));
      }
      goto LAB_017b70a1;
    }
    std::vector<void_*,_std::allocator<void_*>_>::push_back
              ((vector<void_*,_std::allocator<void_*>_> *)&gl.waitSync,&stack0xffffffffffffe168);
    pvVar3 = display.m_display;
    if ((this->m_use == USE_MAKECURRENT) || (this->m_use == USE_CLEAR)) {
      pGVar9 = (GLdouble *)eglu::UniqueDisplay::operator*((UniqueDisplay *)&config);
      pvVar10 = eglu::UniqueSurface::operator*
                          ((UniqueSurface *)
                           &contexts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      pvVar11 = eglu::UniqueSurface::operator*
                          ((UniqueSurface *)
                           &contexts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      local_2250 = (**(code **)(*pvVar3 + 0x138))(pvVar3,pGVar9,pvVar10,pvVar11,pvStack_1e98);
      pvVar3 = display.m_display;
      local_2254 = (**(code **)(*display.m_display + 0xf8))();
      if ((local_2250 == 0) || (local_2254 != 0x3000)) {
        tcu::TestLog::operator<<
                  (&local_23d8,(TestLog *)resultCollector.m_message.field_2._8_8_,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<(&local_23d8,(char (*) [16])"Failed to make ");
        local_23e0 = (long)sharedContext + 1;
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_23e0);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [21])"th context current: ");
        EVar14 = eglu::getErrorStr(local_2254);
        local_2400 = EVar14.m_getName;
        local_23f8 = EVar14.m_value;
        local_23f0.m_getName = local_2400;
        local_23f0.m_value = local_23f8;
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_23f0);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_23d8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2420,"Failed to make context current",
                   (allocator<char> *)((long)&contextNdx + 7));
        tcu::ResultCollector::fail((ResultCollector *)local_b0,&local_2420);
        std::__cxx11::string::~string((string *)&local_2420);
        std::allocator<char>::~allocator((allocator<char> *)((long)&contextNdx + 7));
        goto LAB_017b70a1;
      }
      if (this->m_use == USE_CLEAR) {
        (*gl.clearBufferuiv)((GLenum)pvVar3,(GLint)pGVar9,extraout_RDX);
        GVar13 = 0x4000;
        (*gl.clampColor)(0x4000,(GLenum)pGVar9);
        (*gl.fenceSync)(GVar13,(GLbitfield)pGVar9);
        dVar1 = (*gl.getDoublev)(GVar13,pGVar9);
        glu::checkError(dVar1,"Failed to clear color.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiContextTests.cpp"
                        ,0xbe);
      }
    }
    sharedContext = (EGLContext)((long)sharedContext + 1);
  } while( true );
}

Assistant:

tcu::TestCase::IterateResult MultiContextTest::iterate (void)
{
	const deUint32					seed			= m_sharing == SHARING_SHARED ? 2498541716u : 8825414;
	const size_t					maxContextCount	= 128;
	const size_t					minContextCount	= 32;
	const eglw::EGLint				attribList[]	=
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};
	const eglw::EGLint				pbufferAttribList[]	=
	{
		EGL_WIDTH,	64,
		EGL_HEIGHT,	64,
		EGL_NONE
	};

	TestLog&						log				= m_testCtx.getLog();
	tcu::ResultCollector			resultCollector	(log);
	de::Random						rng				(seed);

	const eglw::Library&			egl				= m_eglTestCtx.getLibrary();
	const eglu::UniqueDisplay		display			(egl, eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay()));
	const eglw::EGLConfig			config			= getConfig(egl, *display);

	const eglu::UniqueSurface		surface			(egl, *display, m_use != USE_NONE ? egl.createPbufferSurface(*display, config, pbufferAttribList) : EGL_NO_SURFACE);
	EGLU_CHECK_MSG(egl, "Failed to create pbuffer.");

	std::vector<eglw::EGLContext>	contexts;
	glw::Functions					gl;

	contexts.reserve(maxContextCount);

	log << TestLog::Message << "Trying to create " << maxContextCount << (m_sharing == SHARING_SHARED ? " shared " : " ") << "contexts." << TestLog::EndMessage;
	log << TestLog::Message << "Requiring that at least " << minContextCount << " contexts can be created." << TestLog::EndMessage;

	if (m_use == USE_CLEAR)
		m_eglTestCtx.initGLFunctions(&gl, glu::ApiType::es(2,0));

	EGLU_CHECK_CALL(egl, bindAPI(EGL_OPENGL_ES_API));

	try
	{
		for (size_t contextCount = 0; contextCount < maxContextCount; contextCount++)
		{
			const eglw::EGLContext	sharedContext	= (m_sharing == SHARING_SHARED && contextCount > 0 ? contexts[rng.getUint32() % (deUint32)contextCount] : EGL_NO_CONTEXT);
			const eglw::EGLContext	context			= egl.createContext(*display, config, sharedContext, attribList);
			const eglw::EGLint		error			= egl.getError();

			if (context == EGL_NO_CONTEXT || error != EGL_SUCCESS)
			{
				log << TestLog::Message << "Got error after creating " << contextCount << " contexts." << TestLog::EndMessage;

				if (error == EGL_BAD_ALLOC)
				{
					if (contextCount < minContextCount)
						resultCollector.fail("Couldn't create the minimum number of contexts required.");
					else
						log << TestLog::Message << "Got EGL_BAD_ALLOC." << TestLog::EndMessage;
				}
				else
					resultCollector.fail("eglCreateContext() produced error that is not EGL_BAD_ALLOC: " + eglu::getErrorStr(error).toString());

				if (context != EGL_NO_CONTEXT)
					resultCollector.fail("eglCreateContext() produced error, but context is not EGL_NO_CONTEXT");

				break;
			}
			else
			{
				contexts.push_back(context);

				if (m_use == USE_MAKECURRENT || m_use == USE_CLEAR)
				{
					const eglw::EGLBoolean	result				= egl.makeCurrent(*display, *surface, *surface, context);
					const eglw::EGLint		makeCurrentError	= egl.getError();

					if (!result || makeCurrentError != EGL_SUCCESS)
					{
						log << TestLog::Message << "Failed to make " << (contextCount + 1) << "th context current: " << eglu::getErrorStr(makeCurrentError) << TestLog::EndMessage;
						resultCollector.fail("Failed to make context current");

						break;
					}
					else if (m_use == USE_CLEAR)
					{
						gl.clearColor(0.25f, 0.75f, 0.50f, 1.00f);
						gl.clear(GL_COLOR_BUFFER_BIT);
						gl.finish();
						GLU_CHECK_GLW_MSG(gl, "Failed to clear color.");
					}
				}
			}
		}

		for (size_t contextNdx = 0; contextNdx < contexts.size(); contextNdx++)
		{
			EGLU_CHECK_CALL(egl, destroyContext(*display, contexts[contextNdx]));
			contexts[contextNdx] = EGL_NO_CONTEXT;
		}

		if (m_use == USE_MAKECURRENT || m_use == USE_CLEAR)
			EGLU_CHECK_CALL(egl, makeCurrent(*display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
	}
	catch (...)
	{
		for (size_t contextNdx = 0; contextNdx < contexts.size(); contextNdx++)
		{
			if (contexts[contextNdx] != EGL_NO_CONTEXT)
				EGLU_CHECK_CALL(egl, destroyContext(*display, contexts[contextNdx]));
		}

		if (m_use == USE_MAKECURRENT || m_use == USE_CLEAR)
			EGLU_CHECK_CALL(egl, makeCurrent(*display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));

		throw;
	}

	resultCollector.setTestContextResult(m_testCtx);
	return STOP;
}